

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAnnotPtr xmlSchemaNewAnnot(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlSchemaAnnotPtr ret;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x10);
  if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory(ctxt,"allocating annotation",node);
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x10);
    ctxt_local->errCtxt = node;
  }
  return (xmlSchemaAnnotPtr)ctxt_local;
}

Assistant:

static xmlSchemaAnnotPtr
xmlSchemaNewAnnot(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlSchemaAnnotPtr ret;

    ret = (xmlSchemaAnnotPtr) xmlMalloc(sizeof(xmlSchemaAnnot));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt, "allocating annotation", node);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAnnot));
    ret->content = node;
    return (ret);
}